

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprinter.cpp
# Opt level: O2

void __thiscall QPrinter::setCollateCopies(QPrinter *this,bool collate)

{
  QPrinterPrivate *this_00;
  int iVar1;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_40;
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d;
  iVar1 = (*this_00->printEngine->_vptr_QPrintEngine[7])();
  if (iVar1 == 1) {
    local_40._0_4_ = 2;
    local_40._20_4_ = 0;
    local_40._4_8_ = 0;
    local_40._12_8_ = 0;
    local_28 = "default";
    QMessageLogger::warning
              ((char *)local_40.data,"%s: Cannot be changed while printer is active",
               "QPrinter::setCollateCopies");
  }
  else {
    QVariant::QVariant((QVariant *)&local_40,collate);
    QPrinterPrivate::setProperty(this_00,PPK_CollateCopies,(QVariant *)&local_40);
    QVariant::~QVariant((QVariant *)&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPrinter::setCollateCopies(bool collate)
{
    Q_D(QPrinter);
    ABORT_IF_ACTIVE("QPrinter::setCollateCopies");
    d->setProperty(QPrintEngine::PPK_CollateCopies, collate);
}